

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.hpp
# Opt level: O3

void __thiscall
vkt::pipeline::CoordinateCaptureProgram::CoordinateCaptureProgram(CoordinateCaptureProgram *this)

{
  pointer pVVar1;
  
  (this->super_Program)._vptr_Program = (_func_int **)&PTR__CoordinateCaptureProgram_00cf4a28;
  rr::VertexShader::VertexShader(&(this->m_vertexShader).super_VertexShader,2,2);
  (this->m_vertexShader).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00cf4a78;
  *(undefined8 *)
   (this->m_vertexShader).super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  pVVar1 = (this->m_vertexShader).super_VertexShader.m_outputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar1->type = GENERICVECTYPE_FLOAT;
  pVVar1[1].type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&(this->m_fragmentShader).super_FragmentShader,2,1);
  (this->m_fragmentShader).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&PTR_shadeFragments_00cf4ab8;
  pVVar1 = (this->m_fragmentShader).super_FragmentShader.m_inputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar1->type = GENERICVECTYPE_FLOAT;
  pVVar1[1].type = GENERICVECTYPE_FLOAT;
  ((this->m_fragmentShader).super_FragmentShader.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  return;
}

Assistant:

CoordinateCaptureProgram (void)
	{
	}